

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int luaG_traceexec(lua_State *L,Instruction *pc)

{
  uint uVar1;
  CallInfo *pCVar2;
  Proto *p_00;
  int iVar3;
  int iVar4;
  bool bVar5;
  int local_50;
  int newline;
  int npci;
  int oldpc;
  int counthook;
  Proto *p;
  lu_byte mask;
  CallInfo *ci;
  Instruction *pc_local;
  lua_State *L_local;
  
  pCVar2 = L->ci;
  uVar1 = L->hookmask;
  p_00 = *(Proto **)((((pCVar2->func).p)->val).value_.f + 0x18);
  if ((uVar1 & 0xc) == 0) {
    (pCVar2->u).l.trap = 0;
    L_local._4_4_ = 0;
  }
  else {
    (pCVar2->u).l.savedpc = pc + 1;
    bVar5 = false;
    if ((uVar1 & 8) != 0) {
      iVar3 = L->hookcount + -1;
      L->hookcount = iVar3;
      bVar5 = iVar3 == 0;
    }
    if (bVar5) {
      L->hookcount = L->basehookcount;
    }
    else if ((uVar1 & 4) == 0) {
      return 1;
    }
    if ((pCVar2->callstatus & 0x40) == 0) {
      if ((("\b\n\n\t\t\b\b\b\b\b"[*(uint *)((pCVar2->u).c.k + -4) & 0x7f] & 0x20) == 0) ||
         ((*(uint *)((pCVar2->u).c.k + -4) >> 0x10 & 0xff) != 0)) {
        L->top = pCVar2->top;
      }
      if (bVar5) {
        luaD_hook(L,3,-1,0,0);
      }
      if ((uVar1 & 4) != 0) {
        if (L->oldpc < p_00->sizecode) {
          local_50 = L->oldpc;
        }
        else {
          local_50 = 0;
        }
        iVar3 = (int)((long)(pc + 1) - (long)p_00->code >> 2) + -1;
        if ((iVar3 <= local_50) || (iVar4 = changedline(p_00,local_50,iVar3), iVar4 != 0)) {
          iVar4 = luaG_getfuncline(p_00,iVar3);
          luaD_hook(L,2,iVar4,0,0);
        }
        L->oldpc = iVar3;
      }
      if (L->status == '\x01') {
        if (bVar5) {
          L->hookcount = 1;
        }
        pCVar2->callstatus = pCVar2->callstatus | 0x40;
        luaD_throw(L,1);
      }
      L_local._4_4_ = 1;
    }
    else {
      pCVar2->callstatus = pCVar2->callstatus & 0xffbf;
      L_local._4_4_ = 1;
    }
  }
  return L_local._4_4_;
}

Assistant:

int luaG_traceexec (lua_State *L, const Instruction *pc) {
  CallInfo *ci = L->ci;
  lu_byte mask = L->hookmask;
  const Proto *p = ci_func(ci)->p;
  int counthook;
  if (!(mask & (LUA_MASKLINE | LUA_MASKCOUNT))) {  /* no hooks? */
    ci->u.l.trap = 0;  /* don't need to stop again */
    return 0;  /* turn off 'trap' */
  }
  pc++;  /* reference is always next instruction */
  ci->u.l.savedpc = pc;  /* save 'pc' */
  counthook = (mask & LUA_MASKCOUNT) && (--L->hookcount == 0);
  if (counthook)
    resethookcount(L);  /* reset count */
  else if (!(mask & LUA_MASKLINE))
    return 1;  /* no line hook and count != 0; nothing to be done now */
  if (ci->callstatus & CIST_HOOKYIELD) {  /* hook yielded last time? */
    ci->callstatus &= ~CIST_HOOKYIELD;  /* erase mark */
    return 1;  /* do not call hook again (VM yielded, so it did not move) */
  }
  if (!isIT(*(ci->u.l.savedpc - 1)))  /* top not being used? */
    L->top.p = ci->top.p;  /* correct top */
  if (counthook)
    luaD_hook(L, LUA_HOOKCOUNT, -1, 0, 0);  /* call count hook */
  if (mask & LUA_MASKLINE) {
    /* 'L->oldpc' may be invalid; use zero in this case */
    int oldpc = (L->oldpc < p->sizecode) ? L->oldpc : 0;
    int npci = pcRel(pc, p);
    if (npci <= oldpc ||  /* call hook when jump back (loop), */
        changedline(p, oldpc, npci)) {  /* or when enter new line */
      int newline = luaG_getfuncline(p, npci);
      luaD_hook(L, LUA_HOOKLINE, newline, 0, 0);  /* call line hook */
    }
    L->oldpc = npci;  /* 'pc' of last call to line hook */
  }
  if (L->status == LUA_YIELD) {  /* did hook yield? */
    if (counthook)
      L->hookcount = 1;  /* undo decrement to zero */
    ci->callstatus |= CIST_HOOKYIELD;  /* mark that it yielded */
    luaD_throw(L, LUA_YIELD);
  }
  return 1;  /* keep 'trap' on */
}